

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

bool yolo_params_parse(int argc,char **argv,yolo_params *params)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined8 uVar6;
  long lVar7;
  float *in_RDX;
  long in_RSI;
  int in_EDI;
  string arg;
  int i;
  size_t *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  FILE *__stream;
  float in_stack_ffffffffffffff54;
  char **in_stack_ffffffffffffff58;
  undefined1 *in_stack_ffffffffffffff60;
  int argc_00;
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  float *local_18;
  long local_10;
  int local_4;
  
  local_1c = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    if (local_4 <= local_1c) {
      return true;
    }
    __a = *(allocator<char> **)(local_10 + (long)local_1c * 8);
    __s = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if ((bVar1) ||
       (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38), bVar1)
       ) {
      lVar7 = (long)local_1c;
      local_1c = local_1c + 1;
      in_stack_ffffffffffffff58 = *(char ***)(local_10 + 8 + lVar7 * 8);
      in_stack_ffffffffffffff60 = &stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,(char *)__s,__a);
      in_stack_ffffffffffffff54 =
           std::__cxx11::stof(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      *local_18 = in_stack_ffffffffffffff54;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    }
    else {
      uVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (((bool)uVar2) ||
         (uVar3 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
         (bool)uVar3)) {
        lVar7 = (long)local_1c;
        local_1c = local_1c + 1;
        std::__cxx11::string::operator=
                  ((string *)(local_18 + 2),*(char **)(local_10 + 8 + lVar7 * 8));
      }
      else {
        uVar4 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        if (((bool)uVar4) ||
           (uVar5 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
           (bool)uVar5)) {
          lVar7 = (long)local_1c;
          local_1c = local_1c + 1;
          std::__cxx11::string::operator=
                    ((string *)(local_18 + 10),*(char **)(local_10 + 8 + lVar7 * 8));
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          if (!bVar1) {
            bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
            argc_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
            if (!bVar1) {
              bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
              if ((!bVar1) &&
                 (bVar1 = std::operator==(in_stack_ffffffffffffff40,
                                          (char *)in_stack_ffffffffffffff38), !bVar1)) {
                __stream = _stderr;
                uVar6 = std::__cxx11::string::c_str();
                fprintf(__stream,"error: unknown argument: %s\n",uVar6);
                yolo_print_usage(argc_00,in_stack_ffffffffffffff58,
                                 (yolo_params *)
                                 CONCAT44(in_stack_ffffffffffffff54,
                                          CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5)))));
                exit(0);
              }
              yolo_print_usage(argc_00,in_stack_ffffffffffffff58,
                               (yolo_params *)
                               CONCAT44(in_stack_ffffffffffffff54,
                                        CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,uVar5)))));
              exit(0);
            }
          }
          lVar7 = (long)local_1c;
          local_1c = local_1c + 1;
          std::__cxx11::string::operator=
                    ((string *)(local_18 + 0x12),*(char **)(local_10 + 8 + lVar7 * 8));
        }
      }
    }
    std::__cxx11::string::~string(local_40);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool yolo_params_parse(int argc, char ** argv, yolo_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-th" || arg == "--thresh") {
            params.thresh = std::stof(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--inp") {
            params.fname_inp = argv[++i];
        } else if (arg == "-o" || arg == "--out") {
            params.fname_out = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            yolo_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            yolo_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}